

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.pb.cc
# Opt level: O0

void google::protobuf::Method::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  Method *pMVar2;
  MessageLite *value;
  string *psVar3;
  bool bVar4;
  Syntax SVar5;
  Method **v1;
  Method **v2;
  char *failure_msg;
  LogMessage *pLVar6;
  RepeatedPtrField<google::protobuf::Option> *this;
  RepeatedPtrField<google::protobuf::Option> *other;
  uint32_t *puVar7;
  ulong uVar8;
  Arena *pAVar9;
  allocator<char> local_161;
  string local_160;
  allocator<char> local_139;
  string local_138;
  allocator<char> local_111;
  MessageLite local_110 [2];
  uint local_f0;
  uint32_t cached_has_bits;
  LogMessage local_e0;
  Voidify local_c9;
  Method *local_c8;
  Nullable<const_char_*> local_c0;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Method *from;
  Method *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  Method *local_90;
  anon_union_64_1_493b367e_for_Method_3 *local_88;
  string *local_80;
  Method *local_78;
  anon_union_64_1_493b367e_for_Method_3 *local_70;
  string *local_68;
  Method *local_60;
  anon_union_64_1_493b367e_for_Method_3 *local_58;
  string *local_50;
  Method *local_48;
  anon_union_64_1_493b367e_for_Method_3 *local_40;
  string *local_38;
  Method *local_30;
  anon_union_64_1_493b367e_for_Method_3 *local_28;
  string *local_20;
  Method *local_18;
  anon_union_64_1_493b367e_for_Method_3 *local_10;
  
  local_c8 = (Method *)from_msg;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)from_msg;
  from = (Method *)to_msg;
  _this = (Method *)from_msg;
  from_msg_local = to_msg;
  v1 = absl::lts_20250127::log_internal::GetReferenceableValue<google::protobuf::Method_const*>
                 (&local_c8);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue<google::protobuf::Method*>(&from);
  local_c0 = absl::lts_20250127::log_internal::
             Check_NEImpl<google::protobuf::Method_const*,google::protobuf::Method*>
                       (v1,v2,"&from != _this");
  if (local_c0 == (Nullable<const_char_*>)0x0) {
    local_f0 = 0;
    this = _internal_mutable_options(from);
    other = _internal_options((Method *)absl_log_internal_check_op_result);
    RepeatedPtrField<google::protobuf::Option>::MergeFrom(this,other);
    puVar7 = internal::HasBits<1>::operator[]
                       ((HasBits<1> *)(absl_log_internal_check_op_result + 0x10),0);
    local_f0 = *puVar7;
    if ((local_f0 & 0x3f) != 0) {
      if ((local_f0 & 1) != 0) {
        _internal_name_abi_cxx11_((Method *)absl_log_internal_check_op_result);
        uVar8 = std::__cxx11::string::empty();
        pMVar2 = from;
        if ((uVar8 & 1) == 0) {
          local_80 = _internal_name_abi_cxx11_((Method *)absl_log_internal_check_op_result);
          local_78 = pMVar2;
          local_70 = &pMVar2->field_0;
          puVar7 = internal::HasBits<1>::operator[](&(pMVar2->field_0)._impl_._has_bits_,0);
          psVar3 = local_80;
          *puVar7 = *puVar7 | 1;
          pAVar9 = protobuf::MessageLite::GetArena((MessageLite *)pMVar2);
          internal::ArenaStringPtr::Set<>(&(pMVar2->field_0)._impl_.name_,psVar3,pAVar9);
        }
        else {
          bVar4 = internal::ArenaStringPtr::IsDefault(&(from->field_0)._impl_.name_);
          pMVar2 = from;
          if (bVar4) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_110,anon_var_dwarf_37cdd0 + 5,&local_111);
            local_90 = pMVar2;
            to_msg_local = local_110;
            local_88 = &pMVar2->field_0;
            puVar7 = internal::HasBits<1>::operator[](&(local_88->_impl_)._has_bits_,0);
            value = to_msg_local;
            *(byte *)puVar7 = (byte)*puVar7 | 1;
            pAVar9 = protobuf::MessageLite::GetArena((MessageLite *)pMVar2);
            internal::ArenaStringPtr::Set<>(&(pMVar2->field_0)._impl_.name_,(string *)value,pAVar9);
            std::__cxx11::string::~string((string *)local_110);
            std::allocator<char>::~allocator(&local_111);
          }
        }
      }
      if ((local_f0 & 2) != 0) {
        _internal_request_type_url_abi_cxx11_((Method *)absl_log_internal_check_op_result);
        uVar8 = std::__cxx11::string::empty();
        pMVar2 = from;
        if ((uVar8 & 1) == 0) {
          local_50 = _internal_request_type_url_abi_cxx11_
                               ((Method *)absl_log_internal_check_op_result);
          local_48 = pMVar2;
          local_40 = &pMVar2->field_0;
          puVar7 = internal::HasBits<1>::operator[](&(pMVar2->field_0)._impl_._has_bits_,0);
          psVar3 = local_50;
          *puVar7 = *puVar7 | 2;
          pAVar9 = protobuf::MessageLite::GetArena((MessageLite *)pMVar2);
          internal::ArenaStringPtr::Set<>(&(pMVar2->field_0)._impl_.request_type_url_,psVar3,pAVar9)
          ;
        }
        else {
          bVar4 = internal::ArenaStringPtr::IsDefault(&(from->field_0)._impl_.request_type_url_);
          pMVar2 = from;
          if (bVar4) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_138,anon_var_dwarf_37cdd0 + 5,&local_139);
            local_60 = pMVar2;
            local_68 = &local_138;
            local_58 = &pMVar2->field_0;
            puVar7 = internal::HasBits<1>::operator[](&(local_58->_impl_)._has_bits_,0);
            psVar3 = local_68;
            *(byte *)puVar7 = (byte)*puVar7 | 2;
            pAVar9 = protobuf::MessageLite::GetArena((MessageLite *)pMVar2);
            internal::ArenaStringPtr::Set<>
                      (&(pMVar2->field_0)._impl_.request_type_url_,psVar3,pAVar9);
            std::__cxx11::string::~string((string *)&local_138);
            std::allocator<char>::~allocator(&local_139);
          }
        }
      }
      if ((local_f0 & 4) != 0) {
        _internal_response_type_url_abi_cxx11_((Method *)absl_log_internal_check_op_result);
        uVar8 = std::__cxx11::string::empty();
        pMVar2 = from;
        if ((uVar8 & 1) == 0) {
          local_20 = _internal_response_type_url_abi_cxx11_
                               ((Method *)absl_log_internal_check_op_result);
          local_18 = pMVar2;
          local_10 = &pMVar2->field_0;
          puVar7 = internal::HasBits<1>::operator[](&(pMVar2->field_0)._impl_._has_bits_,0);
          psVar3 = local_20;
          *puVar7 = *puVar7 | 4;
          pAVar9 = protobuf::MessageLite::GetArena((MessageLite *)pMVar2);
          internal::ArenaStringPtr::Set<>
                    (&(pMVar2->field_0)._impl_.response_type_url_,psVar3,pAVar9);
        }
        else {
          bVar4 = internal::ArenaStringPtr::IsDefault(&(from->field_0)._impl_.response_type_url_);
          pMVar2 = from;
          if (bVar4) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_160,anon_var_dwarf_37cdd0 + 5,&local_161);
            local_30 = pMVar2;
            local_38 = &local_160;
            local_28 = &pMVar2->field_0;
            puVar7 = internal::HasBits<1>::operator[](&(local_28->_impl_)._has_bits_,0);
            psVar3 = local_38;
            *(byte *)puVar7 = (byte)*puVar7 | 4;
            pAVar9 = protobuf::MessageLite::GetArena((MessageLite *)pMVar2);
            internal::ArenaStringPtr::Set<>
                      (&(pMVar2->field_0)._impl_.response_type_url_,psVar3,pAVar9);
            std::__cxx11::string::~string((string *)&local_160);
            std::allocator<char>::~allocator(&local_161);
          }
        }
      }
      if (((local_f0 & 8) != 0) &&
         (bVar4 = _internal_request_streaming((Method *)absl_log_internal_check_op_result), bVar4))
      {
        (from->field_0)._impl_.request_streaming_ =
             (bool)(absl_log_internal_check_op_result[0x48] & 1);
      }
      if (((local_f0 & 0x10) != 0) &&
         (bVar4 = _internal_response_streaming((Method *)absl_log_internal_check_op_result), bVar4))
      {
        (from->field_0)._impl_.response_streaming_ =
             (bool)(absl_log_internal_check_op_result[0x49] & 1);
      }
      if (((local_f0 & 0x20) != 0) &&
         (SVar5 = _internal_syntax((Method *)absl_log_internal_check_op_result),
         SVar5 != SYNTAX_PROTO2)) {
        (from->field_0)._impl_.syntax_ = *(int *)(absl_log_internal_check_op_result + 0x4c);
      }
    }
    uVar1 = local_f0;
    puVar7 = internal::HasBits<1>::operator[](&(from->field_0)._impl_._has_bits_,0);
    *puVar7 = uVar1 | *puVar7;
    internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
              (&(from->super_Message).super_MessageLite._internal_metadata_,
               (InternalMetadata *)(absl_log_internal_check_op_result + 8));
    return;
  }
  failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_c0);
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_e0,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/api.pb.cc"
             ,0x491,failure_msg);
  pLVar6 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_e0);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_c9,pLVar6);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_e0);
}

Assistant:

void Method::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<Method*>(&to_msg);
  auto& from = static_cast<const Method&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.Method)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_options()->MergeFrom(
      from._internal_options());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000003fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      if (!from._internal_name().empty()) {
        _this->_internal_set_name(from._internal_name());
      } else {
        if (_this->_impl_.name_.IsDefault()) {
          _this->_internal_set_name("");
        }
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      if (!from._internal_request_type_url().empty()) {
        _this->_internal_set_request_type_url(from._internal_request_type_url());
      } else {
        if (_this->_impl_.request_type_url_.IsDefault()) {
          _this->_internal_set_request_type_url("");
        }
      }
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      if (!from._internal_response_type_url().empty()) {
        _this->_internal_set_response_type_url(from._internal_response_type_url());
      } else {
        if (_this->_impl_.response_type_url_.IsDefault()) {
          _this->_internal_set_response_type_url("");
        }
      }
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      if (from._internal_request_streaming() != 0) {
        _this->_impl_.request_streaming_ = from._impl_.request_streaming_;
      }
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      if (from._internal_response_streaming() != 0) {
        _this->_impl_.response_streaming_ = from._impl_.response_streaming_;
      }
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      if (from._internal_syntax() != 0) {
        _this->_impl_.syntax_ = from._impl_.syntax_;
      }
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}